

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O0

pair<tyti::stl::basic_solid<float>,_bool> * __thiscall
tyti::stl::read<float,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (pair<tyti::stl::basic_solid<float>,_bool> *__return_storage_ptr__,stl *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                end)

{
  bool local_89;
  undefined1 local_88 [7];
  bool r;
  basic_solid<float> o;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end_local;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin_local;
  
  o.attributes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)begin._M_current;
  basic_solid<float>::basic_solid((basic_solid<float> *)local_88);
  local_89 = read<float,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                       ((basic_solid<float> *)local_88,
                        (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )this,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )o.attributes.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::make_pair<tyti::stl::basic_solid<float>,bool>
            (__return_storage_ptr__,(basic_solid<float> *)local_88,&local_89);
  basic_solid<float>::~basic_solid((basic_solid<float> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair< basic_solid<T>, bool > read(IterT begin, IterT end)
        {
            basic_solid<T> o;
            bool r = read(o, begin, end);
            return std::make_pair<basic_solid<T>, bool>(std::move(o), std::move(r));
        }